

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool bitset_container_is_subset_run(bitset_container_t *container1,run_container_t *container2)

{
  int iVar1;
  int32_t n_runs;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  uint64_t uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  
  iVar5 = container1->cardinality;
  if (iVar5 != -1) {
    lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar2 + 4) & 0x20) == 0) {
      iVar1 = container2->n_runs;
      lVar2 = (long)iVar1;
      if (0 < lVar2) {
        lVar4 = 0;
        do {
          iVar1 = iVar1 + (uint)container2->runs[lVar4].length;
          lVar4 = lVar4 + 1;
        } while (lVar2 != lVar4);
      }
    }
    else {
      iVar1 = _avx2_run_container_cardinality(container2);
    }
    if (iVar1 < iVar5) {
      return false;
    }
  }
  lVar2 = 0;
  iVar5 = 0;
  do {
    if (container2->n_runs <= iVar5) {
      do {
        bVar10 = container1->words[lVar2] == 0;
        if (!bVar10) {
          return bVar10;
        }
        bVar9 = lVar2 != 0x3ff;
        lVar2 = lVar2 + 1;
      } while (bVar9);
      return bVar10;
    }
    uVar6 = container1->words[lVar2];
    if (uVar6 != 0) {
      do {
        if (container2->n_runs <= iVar5) {
          return false;
        }
        lVar4 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        uVar7 = (uint)lVar4 | (int)lVar2 << 6;
        uVar8 = (uint)container2->runs[iVar5].value;
        if (uVar7 < uVar8) {
          return false;
        }
        uVar8 = container2->runs[iVar5].length + uVar8;
        uVar3 = uVar6 - 1;
        if (uVar8 < uVar7) {
          uVar3 = 0xffffffffffffffff;
        }
        iVar5 = iVar5 + (uint)(uVar8 < uVar7);
        uVar6 = uVar6 & uVar3;
      } while (uVar6 != 0);
    }
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x400) {
      return true;
    }
  } while( true );
}

Assistant:

bool bitset_container_is_subset_run(const bitset_container_t* container1,
                                    const run_container_t* container2) {
    // todo: this code could be much faster
    if (container1->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container1->cardinality > run_container_cardinality(container2)) {
            return false;
        }
    }
    int32_t i_bitset = 0, i_run = 0;
    while (i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS &&
           i_run < container2->n_runs) {
        uint64_t w = container1->words[i_bitset];
        while (w != 0 && i_run < container2->n_runs) {
            uint32_t start = container2->runs[i_run].value;
            uint32_t stop = start + container2->runs[i_run].length;
            uint64_t t = w & (~w + 1);
            uint16_t r = i_bitset * 64 + __builtin_ctzll(w);
            if (r < start) {
                return false;
            } else if (r > stop) {
                i_run++;
                continue;
            } else {
                w ^= t;
            }
        }
        if (w == 0) {
            i_bitset++;
        } else {
            return false;
        }
    }
    if (i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS) {
        // terminated iterating on the run containers, check that rest of bitset
        // is empty
        for (; i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS; i_bitset++) {
            if (container1->words[i_bitset] != 0) {
                return false;
            }
        }
    }
    return true;
}